

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat<float> *
fetchAlpha8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  byte bVar1;
  float *pfVar2;
  ulong uVar3;
  
  if (0 < count) {
    pfVar2 = &buffer->b;
    uVar3 = 0;
    do {
      bVar1 = src[uVar3 + (long)index];
      ((QRgbaFloat<float> *)(pfVar2 + -2))->r = 0.0;
      pfVar2[-1] = 0.0;
      *pfVar2 = 0.0;
      pfVar2[1] = (float)bVar1 * 0.003921569;
      uVar3 = uVar3 + 1;
      pfVar2 = pfVar2 + 4;
    } while ((uint)count != uVar3);
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL fetchAlpha8To(QRgba *buffer, const uchar *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgba::fromRgba(0, 0, 0, src[index + i]);
    return buffer;
}